

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_write_format_gnutar_filenames.c
# Opt level: O0

void test_write_format_gnutar_linknames(void)

{
  int iVar1;
  char *pcVar2;
  int local_3c;
  size_t sStack_38;
  int i;
  size_t used;
  archive *a;
  archive_entry *template;
  archive_entry *ae;
  char *buff;
  size_t buffsize;
  
  buff = (char *)0xf4240;
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_gnutar_filenames.c"
                      ,L'g',0xa000,"S_IFLNK",0xa000,"AE_IFLNK",(void *)0x0);
  ae = (archive_entry *)malloc((size_t)buff);
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_gnutar_filenames.c"
                   ,L'k',(uint)(ae != (archive_entry *)0x0),"buff != NULL",(void *)0x0);
  a = (archive *)archive_entry_new();
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_gnutar_filenames.c"
                   ,L'n',(uint)((archive_entry *)a != (archive_entry *)0x0),
                   "(template = archive_entry_new()) != NULL",(void *)0x0);
  archive_entry_set_atime((archive_entry *)a,2,0x14);
  archive_entry_set_birthtime((archive_entry *)a,3,0x1e);
  archive_entry_set_ctime((archive_entry *)a,4,0x28);
  archive_entry_set_mtime((archive_entry *)a,5,0x32);
  archive_entry_set_mode((archive_entry *)a,0xa1ed);
  archive_entry_copy_pathname((archive_entry *)a,"link");
  for (local_3c = 0; local_3c < 2000; local_3c = local_3c + 1) {
    filename[local_3c] = 'a';
    filename[local_3c + 1] = '\0';
    archive_entry_copy_symlink((archive_entry *)a,filename);
    used = (size_t)archive_write_new();
    assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_gnutar_filenames.c"
                     ,L'|',(uint)((archive *)used != (archive *)0x0),
                     "(a = archive_write_new()) != NULL",(void *)0x0);
    iVar1 = archive_write_set_format_gnutar((archive *)used);
    assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_gnutar_filenames.c"
                     ,L'}',(uint)(iVar1 == 0),"0 == archive_write_set_format_gnutar(a)",(void *)used
                    );
    iVar1 = archive_write_add_filter_none((archive *)used);
    assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_gnutar_filenames.c"
                     ,L'~',(uint)(iVar1 == 0),"0 == archive_write_add_filter_none(a)",(void *)used);
    iVar1 = archive_write_open_memory((archive *)used,ae,(size_t)buff,&stack0xffffffffffffffc8);
    assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_gnutar_filenames.c"
                     ,L'\x7f',(uint)(iVar1 == 0),
                     "0 == archive_write_open_memory(a, buff, buffsize, &used)",(void *)used);
    iVar1 = archive_write_header((archive *)used,(archive_entry *)a);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_gnutar_filenames.c"
                        ,L'\x80',0,"ARCHIVE_OK",(long)iVar1,"archive_write_header(a, template)",
                        (void *)used);
    iVar1 = archive_write_close((archive *)used);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_gnutar_filenames.c"
                        ,L'\x81',0,"ARCHIVE_OK",(long)iVar1,"archive_write_close(a)",(void *)used);
    iVar1 = archive_write_free((archive *)used);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_gnutar_filenames.c"
                        ,L'\x82',0,"ARCHIVE_OK",(long)iVar1,"archive_write_free(a)",(void *)used);
    used = (size_t)archive_read_new();
    assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_gnutar_filenames.c"
                     ,L'\x86',(uint)((archive *)used != (archive *)0x0),
                     "(a = archive_read_new()) != NULL",(void *)0x0);
    iVar1 = archive_read_support_format_all((archive *)used);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_gnutar_filenames.c"
                        ,L'\x87',0,"0",(long)iVar1,"archive_read_support_format_all(a)",(void *)used
                       );
    iVar1 = archive_read_support_filter_all((archive *)used);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_gnutar_filenames.c"
                        ,L'\x88',0,"0",(long)iVar1,"archive_read_support_filter_all(a)",(void *)used
                       );
    iVar1 = archive_read_open_memory((archive *)used,ae,sStack_38);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_gnutar_filenames.c"
                        ,L'\x89',0,"0",(long)iVar1,"archive_read_open_memory(a, buff, used)",
                        (void *)used);
    iVar1 = archive_read_next_header((archive *)used,&template);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_gnutar_filenames.c"
                        ,L'\x8b',0,"0",(long)iVar1,"archive_read_next_header(a, &ae)",(void *)used);
    pcVar2 = archive_entry_pathname(template);
    assertion_equal_string
              ("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_gnutar_filenames.c"
               ,L'\x8c',"link","\"link\"",pcVar2,"archive_entry_pathname(ae)",(void *)0x0,L'\0');
    pcVar2 = archive_entry_symlink(template);
    assertion_equal_string
              ("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_gnutar_filenames.c"
               ,L'\x8d',filename,"filename",pcVar2,"archive_entry_symlink(ae)",(void *)0x0,L'\0');
    iVar1 = archive_read_next_header((archive *)used,&template);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_gnutar_filenames.c"
                        ,L'\x8e',1,"ARCHIVE_EOF",(long)iVar1,"archive_read_next_header(a, &ae)",
                        (void *)used);
    iVar1 = archive_read_close((archive *)used);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_gnutar_filenames.c"
                        ,L'\x8f',0,"ARCHIVE_OK",(long)iVar1,"archive_read_close(a)",(void *)used);
    iVar1 = archive_read_free((archive *)used);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_gnutar_filenames.c"
                        ,L'\x90',0,"ARCHIVE_OK",(long)iVar1,"archive_read_free(a)",(void *)used);
  }
  archive_entry_free((archive_entry *)a);
  free(ae);
  return;
}

Assistant:

DEFINE_TEST(test_write_format_gnutar_linknames)
{
	size_t buffsize = 1000000;
	char *buff;
	struct archive_entry *ae, *template;
	struct archive *a;
	size_t used;
	int i;

#ifdef S_IFLNK
	assertEqualInt(S_IFLNK, AE_IFLNK);
#endif

	buff = malloc(buffsize); /* million bytes of work area */
	assert(buff != NULL);

	/* Create a template entry. */
	assert((template = archive_entry_new()) != NULL);
	archive_entry_set_atime(template, 2, 20);
	archive_entry_set_birthtime(template, 3, 30);
	archive_entry_set_ctime(template, 4, 40);
	archive_entry_set_mtime(template, 5, 50);
	archive_entry_set_mode(template, AE_IFLNK | 0755);
	archive_entry_copy_pathname(template, "link");

	for (i = 0; i < 2000; ++i) {
		filename[i] = 'a';
		filename[i + 1] = '\0';
		archive_entry_copy_symlink(template, filename);

		/* Write a one-item gnutar format archive. */
		assert((a = archive_write_new()) != NULL);
		assertA(0 == archive_write_set_format_gnutar(a));
		assertA(0 == archive_write_add_filter_none(a));
		assertA(0 == archive_write_open_memory(a, buff, buffsize, &used));
		assertEqualIntA(a, ARCHIVE_OK, archive_write_header(a, template));
		assertEqualIntA(a, ARCHIVE_OK, archive_write_close(a));
		assertEqualIntA(a, ARCHIVE_OK, archive_write_free(a));


		/* Read back and verify the filename. */
		assert((a = archive_read_new()) != NULL);
		assertEqualIntA(a, 0, archive_read_support_format_all(a));
		assertEqualIntA(a, 0, archive_read_support_filter_all(a));
		assertEqualIntA(a, 0, archive_read_open_memory(a, buff, used));
		
		assertEqualIntA(a, 0, archive_read_next_header(a, &ae));
		assertEqualString("link", archive_entry_pathname(ae));
		assertEqualString(filename, archive_entry_symlink(ae));
		assertEqualIntA(a, ARCHIVE_EOF, archive_read_next_header(a, &ae));
		assertEqualIntA(a, ARCHIVE_OK, archive_read_close(a));
		assertEqualIntA(a, ARCHIVE_OK, archive_read_free(a));
	}

	archive_entry_free(template);

	free(buff);
}